

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_value_blob(sqlite3_value *pVal)

{
  int iVar1;
  void *pvVar2;
  
  if ((pVal->flags & 0x12) == 0) {
    pvVar2 = sqlite3ValueText(pVal,'\x01');
    return pvVar2;
  }
  if ((((pVal->flags >> 10 & 1) == 0) || (iVar1 = sqlite3VdbeMemExpandBlob(pVal), iVar1 == 0)) &&
     (*(byte *)&pVal->flags = (byte)pVal->flags | 0x10, pVal->n != 0)) {
    return pVal->z;
  }
  return (void *)0x0;
}

Assistant:

SQLITE_API const void *sqlite3_value_blob(sqlite3_value *pVal){
  Mem *p = (Mem*)pVal;
  if( p->flags & (MEM_Blob|MEM_Str) ){
    if( ExpandBlob(p)!=SQLITE_OK ){
      assert( p->flags==MEM_Null && p->z==0 );
      return 0;
    }
    p->flags |= MEM_Blob;
    return p->n ? p->z : 0;
  }else{
    return sqlite3_value_text(pVal);
  }
}